

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O1

Parsekey __thiscall
free_format_parser::HMpsFF::parseHessian
          (HMpsFF *this,HighsLogOptions *log_options,istream *file,Parsekey keyword)

{
  bool bVar1;
  Parsekey PVar2;
  int iVar3;
  HighsInt HVar4;
  long lVar5;
  size_t start;
  pointer pcVar6;
  HighsInt id;
  char *pcVar7;
  int iVar8;
  HMpsFF *this_00;
  Parsekey unaff_R13D;
  bool bVar9;
  double dVar10;
  bool is_nan;
  bool skip;
  string row_name;
  string coeff_name;
  string col_name;
  size_t begin;
  string section_name;
  string strline;
  bool local_132;
  bool local_131;
  pointer local_130;
  pointer local_128;
  HighsInt local_120;
  Parsekey local_11c;
  HMpsFF *local_118;
  HMpsFF *local_110;
  Parsekey local_104;
  undefined1 local_100 [12];
  HighsInt local_f4;
  char local_f0 [16];
  undefined1 local_e0 [8];
  char *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  HMpsFF *local_c0;
  string local_b8;
  string local_98;
  pointer local_78;
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  string local_50;
  
  local_70._0_8_ = local_60;
  local_70._8_8_ = (pointer)0x0;
  local_60[0] = 0;
  local_118 = (HMpsFF *)log_options;
  if (keyword == kQmatrix) {
    pcVar7 = "QMATRIX";
  }
  else {
    this_00 = this;
    if (keyword != kQuadobj) goto LAB_001fb3c2;
    pcVar7 = "QUADOBJ";
  }
  this_00 = (HMpsFF *)local_70;
  std::__cxx11::string::_M_replace((ulong)this_00,0,(char *)0x0,(ulong)pcVar7);
LAB_001fb3c2:
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_e0 = (undefined1  [8])&local_d0;
  local_d8 = (char *)0x0;
  local_d0._M_local_buf[0] = '\0';
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  local_c0 = (HMpsFF *)&this->q_entries;
  local_104 = keyword;
  while( true ) {
    do {
      bVar1 = getMpsLine(this_00,file,&local_50,&local_131);
      if (!bVar1) {
        unaff_R13D = kFail;
        goto LAB_001fb7b9;
      }
    } while (local_131 != false);
    if ((0.0 < this->time_limit_) &&
       (lVar5 = std::chrono::_V2::system_clock::now(),
       dVar10 = (double)lVar5 / 1000000000.0 - this->start_time,
       this->time_limit_ <= dVar10 && dVar10 != this->time_limit_)) break;
    local_78 = (pointer)0x0;
    local_128 = (pointer)0x0;
    PVar2 = checkFirstWord(this,&local_50,(size_t *)&local_78,(size_t *)&local_128,&local_98);
    if (PVar2 == kNone) {
      local_120 = getColIdx(this,&local_98,true);
      iVar8 = 1;
      local_130 = local_128;
      local_11c = unaff_R13D;
      local_110 = this;
      while( true ) {
        std::__cxx11::string::_M_replace((ulong)local_e0,0,local_d8,0x3d2f67);
        first_word((string *)local_100,&local_50,(size_t)local_130);
        std::__cxx11::string::operator=((string *)local_e0,(string *)local_100);
        if ((char *)local_100._0_8_ != local_f0) {
          operator_delete((void *)local_100._0_8_);
        }
        start = first_word_end(&local_50,(size_t)local_130);
        this_00 = (HMpsFF *)local_e0;
        iVar3 = std::__cxx11::string::compare((char *)this_00);
        bVar1 = false;
        if (iVar3 == 0) break;
        id = 0x3d2f67;
        std::__cxx11::string::_M_replace
                  ((ulong)&local_b8,0,(char *)local_b8._M_string_length,0x3d2f67);
        first_word((string *)local_100,&local_50,start);
        std::__cxx11::string::operator=((string *)&local_b8,(string *)local_100);
        if ((char *)local_100._0_8_ != local_f0) {
          operator_delete((void *)local_100._0_8_);
        }
        pcVar6 = (pointer)first_word_end(&local_50,start);
        iVar3 = std::__cxx11::string::compare((char *)&local_b8);
        if (iVar3 == 0) {
          local_128 = local_130;
          trim((string *)local_e0,&default_non_chars_abi_cxx11_);
          this = local_110;
          trim(&local_98,&default_non_chars_abi_cxx11_);
          bVar1 = false;
          this_00 = local_118;
          highsLogUser((HighsLogOptions *)local_118,kError,
                       "%s has no coefficient for entry \"%s\" in column \"%s\"\n",local_70._0_8_,
                       local_e0,local_98._M_dataplus._M_p);
          unaff_R13D = kFail;
          goto LAB_001fb798;
        }
        this_00 = local_110;
        HVar4 = getColIdx(local_110,(string *)local_e0,true);
        local_132 = false;
        pcVar7 = (char *)getValue(this_00,&local_b8,&local_132,id);
        if (local_132 == true) {
          bVar9 = false;
          this_00 = local_118;
          highsLogUser((HighsLogOptions *)local_118,kError,
                       "Hessian coefficient for entry \"%s\" in column \"%s\" is NaN\n",local_e0,
                       local_98._M_dataplus._M_p);
          local_11c = kFail;
          bVar1 = true;
        }
        else {
          if (((double)pcVar7 != 0.0) || (NAN((double)pcVar7))) {
            if (local_104 == kQmatrix) {
              if (local_120 <= HVar4) {
                local_100._8_4_ = local_120;
                this_00 = local_c0;
                local_100._0_8_ = pcVar7;
                local_f4 = HVar4;
                std::vector<std::tuple<int,int,double>,std::allocator<std::tuple<int,int,double>>>::
                emplace_back<std::tuple<int,int,double>>
                          ((vector<std::tuple<int,int,double>,std::allocator<std::tuple<int,int,double>>>
                            *)local_c0,(tuple<int,_int,_double> *)local_100);
              }
            }
            else {
              local_100._8_4_ = local_120;
              this_00 = local_c0;
              local_100._0_8_ = pcVar7;
              local_f4 = HVar4;
              std::vector<std::tuple<int,int,double>,std::allocator<std::tuple<int,int,double>>>::
              emplace_back<std::tuple<int,int,double>>
                        ((vector<std::tuple<int,int,double>,std::allocator<std::tuple<int,int,double>>>
                          *)local_c0,(tuple<int,_int,_double> *)local_100);
            }
          }
          bVar9 = pcVar6 != (pointer)local_50._M_string_length;
          bVar1 = false;
          local_130 = pcVar6;
        }
        if ((!bVar9) || (iVar8 = iVar8 + -1, bVar1 = false, iVar8 != 0)) break;
      }
      local_128 = local_130;
      bVar1 = !bVar1;
      this = local_110;
      unaff_R13D = local_11c;
    }
    else {
      bVar1 = false;
      this_00 = local_118;
      highsLogDev((HighsLogOptions *)local_118,kInfo,"readMPS: Read %s OK\n",local_70._0_8_);
      unaff_R13D = PVar2;
    }
LAB_001fb798:
    if (!bVar1) {
LAB_001fb7b9:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      if (local_e0 != (undefined1  [8])&local_d0) {
        operator_delete((void *)local_e0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((undefined1 *)local_70._0_8_ != local_60) {
        operator_delete((void *)local_70._0_8_);
      }
      return unaff_R13D;
    }
  }
  unaff_R13D = kTimeout;
  goto LAB_001fb7b9;
}

Assistant:

typename HMpsFF::Parsekey HMpsFF::parseHessian(
    const HighsLogOptions& log_options, std::istream& file,
    const HMpsFF::Parsekey keyword) {
  // Parse Hessian information from QUADOBJ or QMATRIX
  // section according to keyword
  const bool qmatrix = keyword == HMpsFF::Parsekey::kQmatrix;
  std::string section_name;
  if (qmatrix) {
    section_name = "QMATRIX";
  } else if (keyword == HMpsFF::Parsekey::kQuadobj) {
    section_name = "QUADOBJ";
  }
  std::string strline;
  std::string col_name;
  std::string row_name;
  std::string coeff_name;
  size_t end_row_name;
  size_t end_coeff_name;
  HighsInt colidx, rowidx;

  bool skip;
  while (getMpsLine(file, strline, skip)) {
    if (skip) continue;
    if (timeout()) return HMpsFF::Parsekey::kTimeout;

    size_t begin = 0;
    size_t end = 0;
    HMpsFF::Parsekey key = checkFirstWord(strline, begin, end, col_name);

    // start of new section?
    if (key != Parsekey::kNone) {
      highsLogDev(log_options, HighsLogType::kInfo, "readMPS: Read %s OK\n",
                  section_name.c_str());
      return key;
    }

    // Get the column index from the name
    colidx = getColIdx(col_name);
    assert(colidx >= 0 && colidx < num_col);

    // Loop over the maximum of two entries per row of the file
    for (int entry = 0; entry < 2; entry++) {
      // Get the row name
      row_name = "";
      row_name = first_word(strline, end);
      end_row_name = first_word_end(strline, end);

      if (row_name == "") break;

      coeff_name = "";
      coeff_name = first_word(strline, end_row_name);
      end_coeff_name = first_word_end(strline, end_row_name);

      if (coeff_name == "") {
        trim(row_name);
        trim(col_name);
        highsLogUser(
            log_options, HighsLogType::kError,
            "%s has no coefficient for entry \"%s\" in column \"%s\"\n",
            section_name.c_str(), row_name.c_str(), col_name.c_str());
        return HMpsFF::Parsekey::kFail;
      }

      rowidx = getColIdx(row_name);
      assert(rowidx >= 0 && rowidx < num_col);

      bool is_nan = false;
      double coeff = getValue(coeff_name, is_nan);  // atof(word.c_str());
      if (is_nan) {
        highsLogUser(
            log_options, HighsLogType::kError,
            "Hessian coefficient for entry \"%s\" in column \"%s\" is NaN\n",
            row_name.c_str(), col_name.c_str());
        return HMpsFF::Parsekey::kFail;
      }
      if (coeff) {
        if (qmatrix) {
          // QMATRIX has the whole Hessian, so store the entry if the
          // entry is in the lower triangle
          if (rowidx >= colidx)
            q_entries.push_back(std::make_tuple(rowidx, colidx, coeff));
        } else {
          // QSECTION and QUADOBJ has the lower triangle of the
          // Hessian
          q_entries.push_back(std::make_tuple(rowidx, colidx, coeff));
          //          if (rowidx != colidx)
          //            q_entries.push_back(std::make_tuple(colidx, rowidx,
          //            coeff));
        }
      }
      end = end_coeff_name;
      // Don't read more if end of line reached
      if (end == strline.length()) break;
    }
  }

  return HMpsFF::Parsekey::kFail;
}